

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O0

void __thiscall EMWINHandler::handle(EMWINHandler *this,shared_ptr<const_lrit::File> *f)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  string *psVar4;
  void *__buf;
  void *__buf_00;
  string *in_RSI;
  EMWINHandler *in_RDI;
  string path_1;
  SignatureError *error;
  string path;
  Zip zip;
  FilenameBuilder fb;
  timespec time;
  string text;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  Zip *in_stack_fffffffffffffa48;
  FilenameBuilder *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  allocator *this_00;
  File *in_stack_fffffffffffffa98;
  string *text_00;
  FileWriter *in_stack_fffffffffffffb00;
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [40];
  undefined1 local_450 [8];
  string *in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc0;
  FilenameBuilder *in_stack_fffffffffffffbc8;
  allocator local_411;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [40];
  undefined1 local_3a8 [160];
  AWIPS *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  EMWINHandler *in_stack_fffffffffffffd08;
  string local_2d8 [32];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffd88;
  Zip *in_stack_fffffffffffffd90;
  string local_78 [32];
  string local_58 [32];
  NOAALRITHeader local_38;
  char local_24;
  
  text_00 = in_RSI;
  std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26bc07);
  lrit::File::getHeader<lrit::PrimaryHeader>((File *)in_stack_fffffffffffffa50);
  if (local_24 == '\x02') {
    std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x26bc36);
    local_38 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x26bc3e);
    if (local_38.productID == 9) {
      std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x26bc6d);
      lrit::File::getHeader<lrit::AnnotationHeader>((File *)in_stack_fffffffffffffa48);
      std::__cxx11::string::string(local_58,local_78);
      lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x26bcaf);
      bVar1 = extractTimeStamp(in_RDI,text_00,(timespec *)in_RSI);
      if (bVar1) {
        FilenameBuilder::FilenameBuilder(in_stack_fffffffffffffa50);
        std::__cxx11::string::operator=
                  ((string *)&stack0xfffffffffffffd08,(string *)&(in_RDI->config_).dir);
        local_2b8 = 0;
        uStack_2b0 = 0;
        bVar1 = extractAWIPS(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                             in_stack_fffffffffffffcf8);
        if (bVar1) {
          if (local_38.noaaSpecificCompression == '\n') {
            std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x26bdcd);
            lrit::File::getData(in_stack_fffffffffffffa98);
            Zip::Zip(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
            std::
            unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                           *)in_stack_fffffffffffffa60);
            Zip::fileName_abi_cxx11_(in_stack_fffffffffffffa48);
            std::__cxx11::string::operator=(local_2d8,local_3d0);
            std::__cxx11::string::~string(local_3d0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_410,"{filename}",&local_411);
            psVar4 = (string *)&stack0xfffffffffffffbc8;
            std::__cxx11::string::string(psVar4);
            FilenameBuilder::build
                      (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8
                      );
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc8);
            std::__cxx11::string::~string(local_410);
            std::allocator<char>::~allocator((allocator<char> *)&local_411);
            peVar2 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x26bedc);
            Zip::read((Zip *)local_450,(int)local_3a8,__buf,(size_t)psVar4);
            FileWriter::write(peVar2,(int)local_3f0,local_450,0);
            std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffa60);
            if (((in_RDI->config_).json & 1U) != 0) {
              std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x26bf4e);
              std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffa50);
              FileWriter::writeHeader(in_stack_fffffffffffffb00,(File *)in_RDI,text_00);
            }
            std::__cxx11::string::~string(local_3f0);
            Zip::~Zip((Zip *)in_stack_fffffffffffffa50);
          }
          else if (local_38.noaaSpecificCompression == '\0') {
            removeSuffix(in_stack_fffffffffffffa58);
            std::__cxx11::string::operator=(local_2d8,local_478);
            std::__cxx11::string::~string(local_478);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4b8,"{filename}",&local_4b9);
            this_00 = &local_4e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4e0,"TXT",this_00);
            psVar4 = local_4e0;
            FilenameBuilder::build
                      (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8
                      );
            std::__cxx11::string::~string(local_4e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
            std::__cxx11::string::~string(local_4b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
            peVar2 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x26c293);
            peVar3 = std::
                     __shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x26c2a5);
            lrit::File::read((File *)&stack0xfffffffffffffb00,(int)peVar3,__buf_00,(size_t)psVar4);
            FileWriter::write(peVar2,(int)local_498,&stack0xfffffffffffffb00,0);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)this_00);
            if (((in_RDI->config_).json & 1U) != 0) {
              in_stack_fffffffffffffa50 =
                   (FilenameBuilder *)
                   std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x26c30d);
              std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffa50);
              FileWriter::writeHeader(in_stack_fffffffffffffb00,(File *)in_RDI,text_00);
            }
            std::__cxx11::string::~string(local_498);
          }
        }
        FilenameBuilder::~FilenameBuilder(in_stack_fffffffffffffa50);
      }
      std::__cxx11::string::~string(local_58);
    }
  }
  return;
}

Assistant:

void EMWINHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 2 ) {
    return;
  }

  // Filter EMWIN
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 9) {
    return;
  }

  // Extract time stamp from filename
  auto text = f->getHeader<lrit::AnnotationHeader>().text;
  struct timespec time = {0, 0};
  if (!extractTimeStamp(text, time)) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.time = time;

  // Assume we can extract WMO abbreviated heading from filename
  if (!extractAWIPS(text, fb.awips)) {
    return;
  }

  // Decompress if this is a ZIP file
  if (nlh.noaaSpecificCompression == 10) {
    try {
      auto zip = Zip(f->getData());
      fb.filename = zip.fileName();

      // Use filename and extension straight from ZIP file
      const auto path = fb.build("{filename}");
      fileWriter_->write(path, zip.read());
      if (config_.json) {
        fileWriter_->writeHeader(*f, path);
      }
    } catch (const Zip::SignatureError& error) {
      std::cout << "Ignoring " << text << ": " << error.what() << std::endl;
    }
    return;
  }

  // Write with TXT extension if this is not a compressed file
  if (nlh.noaaSpecificCompression == 0) {
    fb.filename = removeSuffix(text);

    // Compressed TXT files also use the uppercase TXT extension
    const auto path = fb.build("{filename}", "TXT");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }
}